

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tutorial2.cpp
# Opt level: O3

void CovarianceTexture(int x,int y)

{
  Covariance4D<Vector,_double> *cov;
  int iVar1;
  ostream *poVar2;
  int iVar3;
  long lVar4;
  int iVar5;
  double *pdVar6;
  Cov4D *pCVar7;
  int iVar8;
  long lVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar19;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar20;
  double dVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  double dVar25;
  double sxy;
  double syy;
  double sxx;
  PosCov surfCov;
  Cov4D pixelCov;
  double local_250;
  Vector local_248;
  Vector local_228;
  double local_208;
  double local_200;
  double local_1f8;
  undefined8 uStack_1f0;
  undefined1 local_1e8 [32];
  double dStack_1c8;
  double local_1c0;
  double local_1b0;
  double local_1a8;
  undefined8 uStack_1a0;
  undefined1 local_198 [16];
  double local_188;
  PosCov local_178;
  Cov4D local_c8;
  
  auVar14._0_8_ = (double)x + 0.5;
  auVar14._8_8_ = (double)y + 0.5;
  auVar15._0_8_ = (double)width;
  auVar15._8_8_ = (double)height;
  auVar15 = divpd(auVar14,auVar15);
  dVar13 = auVar15._0_8_ + -0.5;
  dVar19 = auVar15._8_8_ + -0.5;
  local_188 = cy.z * dVar19 + cx.z * dVar13 + cam.d.z;
  auVar22._0_8_ = cam.d.x + dVar19 * cy.x + dVar13 * cx.x;
  auVar22._8_8_ = cam.d.y + dVar19 * cy.y + dVar13 * cx.y;
  auVar16._0_8_ =
       SQRT(local_188 * local_188 + auVar22._0_8_ * auVar22._0_8_ + auVar22._8_8_ * auVar22._8_8_);
  local_188 = local_188 / auVar16._0_8_;
  auVar16._8_8_ = auVar16._0_8_;
  local_198 = divpd(auVar22,auVar16);
  pdVar6 = (double *)&DAT_0011d708;
  pCVar7 = &local_c8;
  for (lVar4 = 10; lVar4 != 0; lVar4 = lVar4 + -1) {
    (pCVar7->matrix)._M_elems[0] = *pdVar6;
    pdVar6 = pdVar6 + 1;
    pCVar7 = (Cov4D *)((pCVar7->matrix)._M_elems + 1);
  }
  local_c8.y.y = 0.0;
  local_c8.y.z = 0.0;
  local_c8.x.z = 0.0;
  local_c8.y.x = 0.0;
  local_c8.x.x = 0.0;
  local_c8.x.y = 0.0;
  local_c8.z.x = (double)local_198._0_8_;
  local_c8.z.y = (double)local_198._8_8_;
  local_c8.z.z = local_188;
  Vector::Frame((Vector *)local_198,&local_c8.x,&local_c8.y);
  pdVar6 = &local_178.first.z;
  local_178.first.x = (double)pdVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_178,"");
  std::__cxx11::stringbuf::str((string *)(sout_abi_cxx11_ + 0x18));
  if ((double *)local_178.first.x != pdVar6) {
    operator_delete((void *)local_178.first.x,(long)local_178.first.z + 1);
  }
  local_1e8._16_8_ = cam.o.z;
  local_1e8._0_8_ = cam.o.x;
  local_1e8._8_8_ = cam.o.y;
  stack0xfffffffffffffe30 = local_198;
  local_1c0 = local_188;
  CovarianceFilter(&local_178,&spheres,(Ray *)local_1e8,&local_c8,0,1,
                   (stringstream *)sout_abi_cxx11_);
  cov = &local_178.second;
  operator<<((ostream *)(sout_abi_cxx11_ + 0x10),cov);
  std::ios::widen((char)*(undefined8 *)(sout_abi_cxx11_._16_8_ + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Volume = ",9);
  dVar13 = Covariance::Covariance4D<Vector,_double>::Volume(cov);
  poVar2 = std::ostream::_M_insert<double>(dVar13);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(sout_abi_cxx11_._16_8_ + -0x18) + '(');
  std::ostream::put('(');
  std::ostream::flush();
  local_200 = 0.0;
  local_208 = 0.0;
  local_250 = 0.0;
  local_228.z = 0.0;
  local_228.x = 0.0;
  local_228.y = 0.0;
  local_248.z = 0.0;
  local_248.x = 0.0;
  local_248.y = 0.0;
  Covariance::Covariance4D<Vector,_double>::SpatialFilter(cov,&local_200,&local_250,&local_208);
  Covariance::Covariance4D<Vector,_double>::SpatialExtent(cov,&local_228,&local_248);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Spatial filter = [",0x12);
  poVar2 = std::ostream::_M_insert<double>(local_200);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,",",1);
  poVar2 = std::ostream::_M_insert<double>(local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"; ",2);
  poVar2 = std::ostream::_M_insert<double>(local_250);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = std::ostream::_M_insert<double>(local_208);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"Extent = ",9);
  poVar2 = operator<<((ostream *)(sout_abi_cxx11_ + 0x10),&local_228);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = operator<<(poVar2,&local_248);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(sout_abi_cxx11_ + 0x10),"|Dx| = ",7);
  poVar2 = std::ostream::_M_insert<double>
                     (SQRT(local_228.z * local_228.z +
                           local_228.x * local_228.x + local_228.y * local_228.y));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", |Dy| = ",9);
  poVar2 = std::ostream::_M_insert<double>
                     (SQRT(local_248.z * local_248.z +
                           local_248.x * local_248.x + local_248.y * local_248.y));
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  if (0 < height) {
    iVar5 = 0;
    iVar3 = height;
    iVar8 = width;
    do {
      if (0 < iVar8) {
        local_1a8 = (double)iVar5 + 0.5;
        uStack_1a0 = 0;
        uVar10 = 0;
        do {
          auVar17._0_8_ = (double)(int)uVar10 + 0.5;
          auVar11._0_8_ = (double)iVar8;
          auVar11._8_8_ = (double)height;
          auVar17._8_8_ = local_1a8;
          auVar15 = divpd(auVar17,auVar11);
          dVar13 = auVar15._0_8_ + -0.5;
          dVar19 = auVar15._8_8_ + -0.5;
          local_1c0 = cy.z * dVar19 + cx.z * dVar13 + cam.d.z;
          local_1e8._16_8_ = cam.o.z;
          local_1e8._0_8_ = cam.o.x;
          local_1e8._8_8_ = cam.o.y;
          auVar23._0_8_ = cam.d.x + dVar19 * cy.x + dVar13 * cx.x;
          auVar23._8_8_ = cam.d.y + dVar19 * cy.y + dVar13 * cx.y;
          auVar18._0_8_ =
               SQRT(local_1c0 * local_1c0 +
                    auVar23._0_8_ * auVar23._0_8_ + auVar23._8_8_ * auVar23._8_8_);
          local_1c0 = local_1c0 / auVar18._0_8_;
          auVar18._8_8_ = auVar18._0_8_;
          register0x00001280 = divpd(auVar23,auVar18);
          iVar3 = (int)((long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)spheres.super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
                              super__Vector_impl_data._M_start >> 4) * -0x49249249;
          if (iVar3 != 0) {
            iVar8 = height * (iVar8 + ~uVar10);
            lVar9 = (long)iVar3;
            dVar13 = 1e+20;
            uVar12 = 0;
            lVar4 = lVar9 * 0x70;
            do {
              lVar9 = lVar9 + -1;
              local_1f8 = dVar13;
              uStack_1f0 = uVar12;
              dVar13 = Sphere::Intersect((Sphere *)
                                         ((long)&spheres.
                                                 super__Vector_base<Sphere,_std::allocator<Sphere>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[-1].c.x +
                                         lVar4),(Ray *)local_1e8);
              uVar12 = extraout_XMM0_Qb;
              if (local_1f8 <= dVar13 || dVar13 == 0.0) {
                dVar13 = local_1f8;
                uVar12 = uStack_1f0;
              }
              lVar4 = lVar4 + -0x70;
            } while ((int)lVar9 != 0);
            if (dVar13 < 1e+20) {
              dVar21 = local_178.first.x -
                       ((double)local_1e8._24_8_ * dVar13 + (double)local_1e8._0_8_);
              dVar24 = local_178.first.y - (dStack_1c8 * dVar13 + (double)local_1e8._8_8_);
              dVar19 = local_178.first.z - (dVar13 * local_1c0 + (double)local_1e8._16_8_);
              dVar25 = local_178.second.x.z * dVar19 +
                       local_178.second.x.x * dVar21 + local_178.second.x.y * dVar24;
              dVar13 = local_178.second.y.z * dVar19 +
                       local_178.second.y.x * dVar21 + local_178.second.y.y * dVar24;
              dVar19 = dVar19 * local_178.second.z.z +
                       dVar21 * local_178.second.z.x + dVar24 * local_178.second.z.y;
              if (useCovFilter == true) {
                local_1b0 = (dVar25 + dVar25) * dVar13 * local_250 +
                            dVar25 * dVar25 * local_200 + dVar13 * dVar13 * local_208;
                local_1f8 = exp(dVar19 * -10.0 * dVar19);
                dVar13 = exp(local_1b0 * -0.5);
                dVar13 = dVar13 * local_1f8;
LAB_001182db:
                fVar20 = (float)dVar13;
              }
              else {
                dVar21 = SQRT(local_228.z * local_228.z +
                              local_228.x * local_228.x + local_228.y * local_228.y);
                iVar1 = (int)((dVar19 * local_228.z + dVar25 * local_228.x + dVar13 * local_228.y) /
                             dVar21);
                iVar3 = -iVar1;
                if (0 < iVar1) {
                  iVar3 = iVar1;
                }
                fVar20 = 0.0;
                if ((double)iVar3 < dVar21) {
                  dVar21 = SQRT(local_248.z * local_248.z +
                                local_248.x * local_248.x + local_248.y * local_248.y);
                  iVar1 = (int)((dVar13 * local_248.y + dVar25 * local_248.x + dVar19 * local_248.z)
                               / dVar21);
                  iVar3 = -iVar1;
                  if (0 < iVar1) {
                    iVar3 = iVar1;
                  }
                  if ((double)iVar3 < dVar21) {
                    dVar13 = exp(dVar19 * -10.0 * dVar19);
                    goto LAB_001182db;
                  }
                }
              }
              cov_img[iVar8 + iVar5] = fVar20;
            }
          }
          uVar10 = uVar10 + 1;
          iVar3 = height;
          iVar8 = width;
        } while ((int)uVar10 < width);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < iVar3);
  }
  return;
}

Assistant:

void CovarianceTexture(int x, int y) {
   // Generate a covariance matrix at the sampling position
   const auto t = (cx*((x+0.5)/double(width) - .5) + cy*((y+0.5)/double(height) - .5) + cam.d).Normalize();
   //*/
   const auto pixelCov = Cov4D({ 1.0E+5, 0.0, 1.0E+5, 0.0, 0.0, 1.0E+5, 0.0, 0.0, 0.0, 1.0E+5 }, t);
   /*/
   const auto pixelCov = Cov4D({ 1.0E-5, 0.0, 1.0E-5, 0.0, 0.0, 1.0E-5, 0.0, 0.0, 0.0, 1.0E-5 }, t);
   //*/
   sout.str("");
   const auto surfCov  = CovarianceFilter(spheres, Ray(cam.o, t), pixelCov, 0, 1, sout);
   sout << surfCov.second << std::endl;
   sout << "Volume = " << surfCov.second.Volume() << std::endl;
   sout << std::endl;

   double sxx = 0, syy = 0, sxy = 0;
   Vector Dx, Dy;
   try {
      surfCov.second.SpatialFilter(sxx, sxy, syy);
      surfCov.second.SpatialExtent(Dx, Dy);
      sout << "Spatial filter = [" << sxx << "," << sxy << "; " << sxy << ", " << syy << "]"<< std::endl;
      sout << "Extent = " << Dx << ", " << Dy << std::endl;
      sout << "|Dx| = " << Vector::Norm(Dx) << ", |Dy| = " << Vector::Norm(Dy) << std::endl;
   } catch (...) {
      std::cout << "Error: incorrect spatial filter" << std::endl;
      sout << surfCov.second << std::endl;
      return;
   }

   // Loop over the rows and columns of the image and evaluate radiance and
   // covariance per pixel using Monte-Carlo.
   #pragma omp parallel for schedule(dynamic, 1)
   for (int y=0; y<height; y++){
      for (int x=0; x<width; x++) {
         // Pixel index
         int i=(width-x-1)*height+y;

         // Generate the pixel direction
         Vector d = cx*( ( 0.5 + x)/width - .5) +
                    cy*( ( 0.5 + y)/height - .5) + cam.d;
         d.Normalize();

         Ray ray(cam.o, d);
         double t; int id;
         if(!Intersect(spheres, ray, t, id)){ continue; }
         Vector hitp = ray.o + t*ray.d;

         // Evaluate the covariance
         const Vector dx  = surfCov.first - hitp;
         const Vector dU = Vector(Vector::Dot(dx, surfCov.second.x), Vector::Dot(dx, surfCov.second.y), Vector::Dot(dx, surfCov.second.z));
         if(useCovFilter) {
            double bf = dU.x*dU.x*sxx + dU.y*dU.y*syy + 2*dU.x*dU.y*sxy;
            cov_img[i] = exp(-10.0*dU.z*dU.z) * exp(- 0.5* bf);
         } else {

            const double du  = Vector::Dot(dU, Dx) / Vector::Norm(Dx);
            const double dv  = Vector::Dot(dU, Dy) / Vector::Norm(Dy);
            cov_img[i] = (abs(du) < Vector::Norm(Dx) &&
                          abs(dv) < Vector::Norm(Dy)) ? exp(-10.0*dU.z*dU.z) : 0.0;
         }
      }
   }
}